

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O0

void __thiscall scApp::captureOption(scApp *this,argparser *parser,HasArg hasArg)

{
  long lVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  bool captureArg;
  uint32_t indexDecrement;
  string local_70 [16];
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_40 [39];
  byte local_19;
  int local_18;
  int local_14;
  long local_10;
  
  local_18 = 1;
  local_19 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (in_EDX == 1) {
    lVar1 = std::__cxx11::string::size();
    if (lVar1 == 0) goto LAB_00108ea9;
  }
  else {
LAB_00108ea9:
    if (local_14 != 2) goto LAB_00108eb8;
  }
  local_18 = 2;
LAB_00108eb8:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_10 + 0x28),(ulong)(uint)(*(int *)(local_10 + 0x20) - local_18));
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xa0),local_40);
  std::__cxx11::string::~string(local_40);
  if ((local_19 & 1) != 0) {
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::__cxx11::string::operator+=((string *)(in_RDI + 0xa0),local_70);
    std::__cxx11::string::~string(local_70);
  }
  return;
}

Assistant:

void
scApp::captureOption(const argparser& parser, HasArg hasArg)
{
    uint32_t indexDecrement = 1;
    bool captureArg = false;

    if ((hasArg == eOptional && parser.optarg.size() > 0) || hasArg == eRequired)
        indexDecrement = 2;
    scparams += parser.argv[parser.optind - indexDecrement] + " ";
    if (captureArg)
        scparams += parser.optarg + " ";
}